

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

word If_Dec6Perform(word t,int fDerive)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  word *pwVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  long lVar23;
  undefined1 auVar22 [16];
  int Pla2Var [6];
  int Pla2Var_1 [6];
  int Var2Pla [6];
  uint local_a8 [2];
  undefined8 uStack_a0;
  undefined8 local_98;
  ulong local_90;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pwVar14 = Truth6;
  lVar4 = 0;
  do {
    if ((*pwVar14 & t) >> ((byte)(1 << ((byte)lVar4 & 0x1f)) & 0x3f) == (~*pwVar14 & t)) {
      __assert_fail("If_Dec6HasVar( t, i )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                    ,0x1ab,"word If_Dec6Perform(word, int)");
    }
    *(uint *)((long)&local_68 + lVar4 * 4) = (uint)lVar4;
    local_a8[lVar4] = (uint)lVar4;
    lVar4 = lVar4 + 1;
    pwVar14 = pwVar14 + 1;
  } while (lVar4 != 6);
  uVar13 = 1;
  uVar10 = 0;
  uVar12 = 0;
  local_6c = fDerive;
  do {
    local_50 = uVar13;
    if (uVar10 < 5) {
      do {
        iVar6 = *(int *)((long)&local_68 + uVar10 * 4);
        if (iVar6 < 0) {
LAB_004135a8:
          __assert_fail("Var2Pla[v] >= p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0xf0,"word If_Dec6MoveTo(word, int, int, int *, int *)");
        }
        while (iVar6 != 0) {
          if (5 < iVar6) goto LAB_00413589;
          bVar5 = (byte)(1 << ((char)iVar6 - 1U & 0x1f));
          t = (t & PMasks[(long)iVar6 + -1][2]) >> (bVar5 & 0x3f) |
              (PMasks[(long)iVar6 + -1][1] & t) << (bVar5 & 0x3f) | PMasks[(long)iVar6 + -1][0] & t;
          uVar8 = local_a8[(long)iVar6 + -1];
          piVar1 = (int *)((long)&local_68 + (long)(int)uVar8 * 4);
          *piVar1 = *piVar1 + 1;
          uVar11 = local_a8[iVar6];
          piVar1 = (int *)((long)&local_68 + (long)(int)uVar11 * 4);
          *piVar1 = *piVar1 + -1;
          local_a8[iVar6] = uVar8;
          local_a8[(long)iVar6 + -1] = uVar11;
          iVar6 = *(int *)((long)&local_68 + uVar10 * 4);
        }
        if (uVar10 != local_a8[0]) {
LAB_004135c7:
          __assert_fail("Pla2Var[p] == v",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0xfc,"word If_Dec6MoveTo(word, int, int, int *, int *)");
        }
        iVar6 = *(int *)((long)&local_68 + uVar13 * 4);
        if (iVar6 < 1) goto LAB_004135a8;
        while (iVar6 != 1) {
          if (5 < iVar6) {
LAB_00413589:
            __assert_fail("v < 5",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                          ,0xea,"word If_Dec6SwapAdjacent(word, int)");
          }
          bVar5 = (byte)(1 << ((char)iVar6 - 1U & 0x1f));
          t = (t & PMasks[(long)iVar6 + -1][2]) >> (bVar5 & 0x3f) |
              (PMasks[(long)iVar6 + -1][1] & t) << (bVar5 & 0x3f) | PMasks[(long)iVar6 + -1][0] & t;
          uVar8 = local_a8[(long)iVar6 + -1];
          piVar1 = (int *)((long)&local_68 + (long)(int)uVar8 * 4);
          *piVar1 = *piVar1 + 1;
          uVar11 = local_a8[iVar6];
          piVar1 = (int *)((long)&local_68 + (long)(int)uVar11 * 4);
          *piVar1 = *piVar1 + -1;
          local_a8[iVar6] = uVar8;
          local_a8[(long)iVar6 + -1] = uVar11;
          iVar6 = *(int *)((long)&local_68 + uVar13 * 4);
        }
        if (uVar13 != local_a8[1]) goto LAB_004135c7;
        lVar4 = 0;
        uVar8 = 0;
        uVar17 = 0;
        do {
          uVar8 = uVar8 & 0xff | ((uint)uVar17 & 0xff) << 8 |
                  1 << ((byte)(t >> ((byte)lVar4 & 0x3f)) & 0xf);
          uVar17 = (ulong)(uVar8 >> 8);
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x40);
        iVar6 = BitCount8[uVar17] + BitCount8[uVar8 & 0xff];
        if (iVar6 < 2) {
          __assert_fail("Count > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0x1b7,"word If_Dec6Perform(word, int)");
        }
        if (iVar6 == 2) {
          if (fDerive != 0) {
            uVar11 = (uint)t & 0xf;
            lVar4 = 4;
            bVar5 = 1;
            uVar16 = 0;
            uVar8 = uVar11;
            do {
              uVar18 = (uint)(t >> ((byte)lVar4 & 0x3f)) & 0xf;
              uVar19 = 1 << (bVar5 & 0x1f);
              if (uVar18 == uVar11) {
                uVar19 = 0;
                uVar18 = uVar8;
              }
              uVar8 = uVar18;
              uVar16 = uVar16 | uVar19;
              lVar4 = lVar4 + 4;
              bVar5 = bVar5 + 1;
            } while (lVar4 != 0x40);
            uVar12 = (ulong)(int)uVar16;
            uVar10 = 0;
            lVar7 = 0;
            lVar20 = 1;
            lVar4 = 2;
            do {
              lVar2 = *(long *)(local_a8 + lVar4);
              auVar21._8_4_ = (int)((ulong)lVar2 >> 0x20);
              auVar21._0_8_ = lVar2;
              auVar21._12_4_ = -(uint)(lVar2 < 0);
              lVar23 = lVar20 * 4 + 0x10;
              auVar22._8_4_ = (undefined4)lVar23;
              auVar22._12_4_ = (undefined4)((ulong)lVar23 >> 0x20);
              auVar22._0_8_ = lVar23;
              uVar12 = uVar12 | CONCAT44(-(uint)((int)lVar2 < 0),(int)lVar2) << lVar7 * 4 + 0x10;
              uVar10 = uVar10 | auVar21._8_8_ << auVar22._8_8_;
              lVar7 = lVar7 + 2;
              lVar20 = lVar20 + 2;
              lVar4 = lVar4 + 2;
            } while (lVar4 != 6);
            uVar17 = (ulong)(uVar8 << 4 | uVar11);
            return uVar13 << 0x34 | uVar17 << 0x28 | uVar17 << 0x20 | (ulong)local_a8[0] << 0x30 |
                   0x700000000000000 | uVar10 | uVar12;
          }
          return 1;
        }
        if (uVar12 == 0) {
          if (iVar6 - 3U < 2) {
            pwVar14 = PMasks[2] + 2;
            lVar4 = 0;
            do {
              uVar17 = ~Truth6[lVar4 + 2] & t;
              bVar5 = (byte)(4 << ((byte)lVar4 & 0x1f));
              uVar12 = Truth6[lVar4 + 2] & t;
              lVar7 = 0;
              uVar8 = 0;
              uVar15 = 0;
              do {
                uVar8 = uVar8 & 0xff | ((uint)uVar15 & 0xff) << 8 |
                        1 << ((byte)((uVar17 << (bVar5 & 0x3f) | uVar17) >> ((byte)lVar7 & 0x3f)) &
                             0xf);
                uVar15 = (ulong)(uVar8 >> 8);
                lVar7 = lVar7 + 4;
              } while (lVar7 != 0x40);
              if (BitCount8[uVar15] + BitCount8[uVar8 & 0xff] < 3) {
                lVar7 = 0;
                uVar8 = 0;
                uVar11 = 0;
                do {
                  uVar8 = uVar8 & 0xff | (uVar11 & 0xff) << 8 |
                          1 << ((uint)((uVar12 >> (bVar5 & 0x3f) | uVar12) >> ((byte)lVar7 & 0x3f))
                               & 0xf);
                  uVar11 = uVar8 >> 8;
                  lVar7 = lVar7 + 4;
                } while (lVar7 != 0x40);
                if (BitCount8[uVar11] + BitCount8[uVar8 & 0xff] < 3) {
                  if (fDerive == 0) {
                    uVar12 = 1;
                  }
                  else {
                    uStack_80 = uStack_a0;
                    local_78 = local_98;
                    local_48 = local_68;
                    uStack_40 = uStack_60;
                    local_38 = local_58;
                    uVar12 = t;
                    if (lVar4 != 3) {
                      iVar6 = *(int *)((long)&uStack_80 + lVar4 * 4);
                      do {
                        bVar5 = (byte)(1 << ((char)lVar4 + 2U & 0x1f));
                        uVar12 = (uVar12 & *pwVar14) >> (bVar5 & 0x3f) |
                                 (pwVar14[-1] & uVar12) << (bVar5 & 0x3f) |
                                 (*(word (*) [3])(pwVar14 + -2))[0] & uVar12;
                        piVar1 = (int *)((long)&local_48 + (long)iVar6 * 4);
                        *piVar1 = *piVar1 + 1;
                        iVar3 = *(int *)((long)&uStack_80 + lVar4 * 4 + 4);
                        piVar1 = (int *)((long)&local_48 + (long)iVar3 * 4);
                        *piVar1 = *piVar1 + -1;
                        *(int *)((long)&uStack_80 + lVar4 * 4 + 4) = iVar6;
                        *(int *)((long)&uStack_80 + lVar4 * 4) = iVar3;
                        lVar4 = lVar4 + 1;
                        pwVar14 = pwVar14 + 3;
                      } while (lVar4 != 3);
                    }
                    uVar17 = uVar12 << 0x20 | uVar12 & 0xffffffff;
                    lVar4 = 0;
                    uVar8 = 0;
                    uVar11 = 0;
                    do {
                      uVar8 = uVar8 & 0xff | (uVar11 & 0xff) << 8 |
                              1 << ((byte)(uVar17 >> ((byte)lVar4 & 0x3f)) & 0xf);
                      uVar11 = uVar8 >> 8;
                      lVar4 = lVar4 + 4;
                    } while (lVar4 != 0x40);
                    if (2 < BitCount8[uVar11] + BitCount8[uVar8 & 0xff]) {
                      __assert_fail("2 >= If_Dec6CofCount2(c0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                                    ,0x16b,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)")
                      ;
                    }
                    local_90 = uVar12 >> 0x20;
                    uVar15 = uVar12 & 0xffffffff00000000 | local_90;
                    lVar4 = 0;
                    uVar8 = 0;
                    uVar11 = 0;
                    do {
                      uVar8 = uVar8 & 0xff | (uVar11 & 0xff) << 8 |
                              1 << ((byte)(uVar15 >> ((byte)lVar4 & 0x3f)) & 0xf);
                      uVar11 = uVar8 >> 8;
                      lVar4 = lVar4 + 4;
                    } while (lVar4 != 0x40);
                    if (2 < BitCount8[uVar11] + BitCount8[uVar8 & 0xff]) {
                      __assert_fail("2 >= If_Dec6CofCount2(c1)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                                    ,0x16c,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)")
                      ;
                    }
                    uVar11 = (uint)uVar12 & 0xf;
                    uVar16 = 0;
                    lVar4 = 4;
                    bVar5 = 1;
                    uVar8 = uVar11;
                    do {
                      uVar19 = (uint)(uVar17 >> ((byte)lVar4 & 0x3f)) & 0xf;
                      uVar18 = 1 << (bVar5 & 0x1f);
                      if (uVar19 == uVar11) {
                        uVar18 = 0;
                        uVar19 = uVar8;
                      }
                      uVar8 = uVar19;
                      uVar16 = uVar16 | uVar18;
                      lVar4 = lVar4 + 4;
                      bVar5 = bVar5 + 1;
                    } while (lVar4 != 0x40);
                    uVar19 = (uint)(uVar12 >> 0x20) & 0xf;
                    local_90 = (ulong)uVar19;
                    uVar18 = 0;
                    lVar4 = 4;
                    bVar5 = 1;
                    uVar12 = local_90;
                    do {
                      uVar17 = (ulong)((uint)(uVar15 >> ((byte)lVar4 & 0x3f)) & 0xf);
                      uVar9 = 1 << (bVar5 & 0x1f);
                      if (uVar17 == local_90) {
                        uVar9 = 0;
                        uVar17 = uVar12;
                      }
                      uVar12 = uVar17;
                      uVar18 = uVar18 | uVar9;
                      lVar4 = lVar4 + 4;
                      bVar5 = bVar5 + 1;
                    } while (lVar4 != 0x40);
                    uVar12 = (long)local_78._4_4_ << 0x3c |
                             (long)local_78._4_4_ << 0x1c | (long)(int)local_78 << 0x18 |
                             (ulong)local_a8[0] << 0x30 | (ulong)local_a8[1] << 0x34 |
                             0x700000000000000 |
                             (ulong)((int)uVar12 * 0x10 + uVar19) << 0x28 |
                             (ulong)(uVar8 << 4 | uVar11) << 0x20 | (long)uStack_80._4_4_ << 0x14 |
                             (long)(int)uStack_80 << 0x10 |
                             (ulong)(uVar16 & 0xff | (uVar18 & 0xff) << 8);
                    fDerive = local_6c;
                  }
                  goto LAB_004131d4;
                }
              }
              lVar4 = lVar4 + 1;
              pwVar14 = pwVar14 + 3;
            } while (lVar4 != 4);
          }
          uVar12 = 0;
        }
LAB_004131d4:
        uVar13 = uVar13 + 1;
      } while (uVar13 != 6);
    }
    uVar10 = uVar10 + 1;
    uVar13 = local_50 + 1;
    if (uVar10 == 6) {
      return uVar12;
    }
  } while( true );
}

Assistant:

word If_Dec6Perform( word t, int fDerive )
{ 
    word r = 0;
    int i, v, u, x, Count, Pla2Var[6], Var2Pla[6];
    // start arrays
    for ( i = 0; i < 6; i++ )
    {
        assert( If_Dec6HasVar( t, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    i = 0;
    for ( v = 0;   v < 6; v++ )
    for ( u = v+1; u < 6; u++, i++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        t = If_Dec6MoveTo( t, u, 1, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        Count = If_Dec6CofCount2( t );
        assert( Count > 1 );
        if ( Count == 2 )
            return !fDerive ? 1 : If_Dec6DeriveDisjoint( t, Pla2Var, Var2Pla );
        // check non-disjoint decomposition
        if ( !r && (Count == 3 || Count == 4) )
        {
            for ( x = 0; x < 4; x++ )
            {
                word c0 = If_Dec6Cofactor( t, x+2, 0 );
                word c1 = If_Dec6Cofactor( t, x+2, 1 );
                if ( If_Dec6CofCount2( c0 ) <= 2 && If_Dec6CofCount2( c1 ) <= 2 )
                {
                    r = !fDerive ? 1 : If_Dec6DeriveNonDisjoint( t, x+2, Pla2Var, Var2Pla );
                    break;
                }
            }
        }
    }
    assert( i == 15 );
    return r;
}